

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O1

int fy_fetch_key(fy_parser *fyp,int c)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  fy_atom *pfVar5;
  fy_atom *pfVar6;
  fy_token *pfVar7;
  uint *handle;
  char *pcVar8;
  int iVar9;
  size_t sVar10;
  bool bVar11;
  fy_atom local_a8;
  undefined8 uStack_70;
  undefined1 auStack_68 [8];
  fy_diag_report_ctx _drc;
  
  handle = (uint *)auStack_68;
  if (c != 0x3f) {
    pcVar8 = "illegal block entry or key mark";
    iVar4 = 0x786;
LAB_00130034:
    *(undefined8 *)(handle + -2) = 0x13003b;
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,iVar4,"fy_fetch_key",pcVar8);
    return -1;
  }
  if ((fyp->flow_level != 0) && (fyp->column <= fyp->indent)) {
    _drc.type = FYET_DEBUG;
    _drc.module = FYEM_UNKNOWN;
    _drc.fyt = (fy_token *)0x0;
    _drc.has_override = false;
    _drc._17_7_ = 0;
    _drc.override_file = (char *)0x0;
    auStack_68._0_4_ = FYET_ERROR;
    auStack_68._4_4_ = FYEM_SCAN;
    pfVar5 = fy_fill_atom_at(fyp,0,1,&local_a8);
    _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar5);
    pcVar8 = "wrongly indented mapping key in flow mode";
LAB_0013014b:
    fy_parser_diag_report(fyp,(fy_diag_report_ctx *)auStack_68,pcVar8);
    return -1;
  }
  if (fyp == (fy_parser *)0x0) {
    iVar9 = 0;
    iVar4 = 0;
    sVar10 = 0;
  }
  else {
    sVar10 = fyp->current_input_pos;
    iVar4 = fyp->line;
    iVar9 = fyp->column;
  }
  pfVar5 = (fy_atom *)auStack_68;
  if (fyp->flow_level == 0) {
    if ((fyp->field_0x70 & 8) == 0) {
      _drc.type = FYET_DEBUG;
      _drc.module = FYEM_UNKNOWN;
      _drc.fyt = (fy_token *)0x0;
      _drc.has_override = false;
      _drc._17_7_ = 0;
      _drc.override_file = (char *)0x0;
      auStack_68._0_4_ = FYET_ERROR;
      auStack_68._4_4_ = FYEM_SCAN;
      pfVar5 = fy_fill_atom_at(fyp,0,1,&local_a8);
      _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar5);
      pcVar8 = "invalid mapping key (not allowed in this context)";
      goto LAB_0013014b;
    }
    pfVar5 = (fy_atom *)auStack_68;
    if (fyp->indent < fyp->column) {
      uStack_70 = 0x13029b;
      iVar3 = fy_push_indent(fyp,fyp->column,true);
      if (iVar3 != 0) {
        pcVar8 = "fy_push_indent() failed";
        iVar4 = 0x79a;
        handle = (uint *)auStack_68;
        goto LAB_00130034;
      }
      pfVar5 = &local_a8;
      iVar3 = 0;
      pfVar6 = fy_fill_atom(fyp,0,pfVar5);
      pfVar7 = fy_token_queue_internal(fyp,&fyp->queued_tokens,FYTT_BLOCK_MAPPING_START,pfVar6);
      if (pfVar7 == (fy_token *)0x0) {
        pcVar8 = "fy_token_queue_internal() failed";
        iVar4 = 0x79f;
        goto LAB_001300e2;
      }
    }
  }
  *(undefined8 *)&pfVar5[-1].increment = 0x1300b5;
  iVar3 = fy_remove_simple_key(fyp,FYTT_KEY);
  if (iVar3 == 0) {
    uVar1 = fyp->column;
    iVar2 = fyp->flow_level;
    fyp->pending_complex_key_column = uVar1;
    (fyp->pending_complex_key_mark).input_pos = sVar10;
    (fyp->pending_complex_key_mark).line = iVar4;
    (fyp->pending_complex_key_mark).column = iVar9;
    iVar3 = 0;
    pfVar5[-1].fyi = (fy_input *)(ulong)uVar1;
    pfVar5[-1].storage_hint = 0x1301c5;
    fy_parser_diag(fyp,0x20,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0x7ab,"fy_fetch_key","pending_complex_key_column %d");
    handle = &pfVar5[-2].increment;
    pfVar5[-2].fyi = (fy_input *)0x1301de;
    pfVar6 = fy_fill_atom(fyp,1,(fy_atom *)handle);
    pfVar5[-2].fyi = (fy_input *)0x1301f0;
    pfVar7 = fy_token_queue(fyp,FYTT_KEY,pfVar6);
    if (pfVar7 != (fy_token *)0x0) {
      bVar11 = iVar2 == 0;
      *(ushort *)&fyp->field_0x70 =
           ((ushort)*(undefined4 *)&fyp->field_0x70 & 0xfff7) + (ushort)bVar11 * 8;
      pcVar8 = "false";
      if (bVar11) {
        pcVar8 = "true";
      }
      pfVar5[-2].storage_hint = (size_t)pcVar8;
      pfVar5[-2].end_mark.line = 0x130253;
      pfVar5[-2].end_mark.column = 0;
      fy_parser_diag(fyp,0x20,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                     ,0x7b2,"fy_fetch_key","simple_key_allowed -> %s\n");
      while( true ) {
        pfVar5[-2].fyi = (fy_input *)0x130261;
        iVar4 = fy_parse_peek_at_offset(fyp,0);
        if ((iVar4 != 9) && (iVar4 != 0x20)) break;
        pfVar5[-2].fyi = (fy_input *)0x130275;
        fy_advance(fyp,iVar4);
      }
      if (iVar4 != 0x23) {
        return 0;
      }
      pfVar5[-2].fyi = (fy_input *)0x1302e6;
      iVar4 = fy_scan_comment(fyp,pfVar7->comment + 1,false);
      if (iVar4 == 0) {
        return 0;
      }
      pcVar8 = "fy_scan_comment() failed";
      iVar4 = 0x7bc;
      goto LAB_00130034;
    }
    pcVar8 = "fy_token_queue() failed";
    iVar4 = 0x7af;
    pfVar5 = (fy_atom *)handle;
  }
  else {
    pcVar8 = "fy_remove_simple_key() failed";
    iVar4 = 0x7a4;
  }
LAB_001300e2:
  *(undefined8 *)&pfVar5[-1].increment = 0x1300e9;
  fy_parser_diag(fyp,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                 ,iVar4,"fy_fetch_key",pcVar8);
  return iVar3;
}

Assistant:

int fy_fetch_key(struct fy_parser *fyp, int c) {
    int rc;
    struct fy_mark mark;
    struct fy_simple_key_mark skm;
    bool target_simple_key_allowed;
    struct fy_token *fyt;

    fyp_error_check(fyp, c == '?', err_out,
                    "illegal block entry or key mark");

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp->flow_level || fyp->column > fyp->indent, err_out,
                          "wrongly indented mapping key in flow mode");

    fy_get_simple_key_mark(fyp, &skm);

    /* we have to save the start mark */
    fy_get_mark(fyp, &mark);

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          fyp->flow_level || fyp->simple_key_allowed, err_out,
                          "invalid mapping key (not allowed in this context)");

    if (!fyp->flow_level && fyp->indent < fyp->column) {

        /* push the new indent level */
        rc = fy_push_indent(fyp, fyp->column, true);
        fyp_error_check(fyp, !rc, err_out_rc,
                        "fy_push_indent() failed");

        fyt = fy_token_queue_internal(fyp, &fyp->queued_tokens,
                                      FYTT_BLOCK_MAPPING_START, fy_fill_atom_a(fyp, 0));
        fyp_error_check(fyp, fyt, err_out_rc,
                        "fy_token_queue_internal() failed");
    }

    rc = fy_remove_simple_key(fyp, FYTT_KEY);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_remove_simple_key() failed");

    target_simple_key_allowed = !fyp->flow_level;

    fyp->pending_complex_key_column = fyp->column;
    fyp->pending_complex_key_mark = mark;
    fyp_scan_debug(fyp, "pending_complex_key_column %d",
                   fyp->pending_complex_key_column);

    fyt = fy_token_queue(fyp, FYTT_KEY, fy_fill_atom_a(fyp, 1));
    fyp_error_check(fyp, fyt, err_out_rc,
                    "fy_token_queue() failed");

    fyp->simple_key_allowed = target_simple_key_allowed;
    fyp_scan_debug(fyp, "simple_key_allowed -> %s\n", fyp->simple_key_allowed ? "true" : "false");

    /* eat whitespace */
    while (fy_is_blank(c = fy_parse_peek(fyp)))
        fy_advance(fyp, c);

    /* comment? */
    if (c == '#') {
        rc = fy_scan_comment(fyp, &fyt->comment[fycp_right], false);
        fyp_error_check(fyp, !rc, err_out_rc,
                        "fy_scan_comment() failed");
    }

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    return rc;
}